

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<LibrarySearchPath>::emplace<LibrarySearchPath_const&>
          (QGenericArrayOps<LibrarySearchPath> *this,qsizetype i,LibrarySearchPath *args)

{
  LibrarySearchPath **ppLVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_b8;
  LibrarySearchPath tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<LibrarySearchPath>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<LibrarySearchPath>).size == i) {
      qVar5 = QArrayDataPointer<LibrarySearchPath>::freeSpaceAtEnd
                        (&this->super_QArrayDataPointer<LibrarySearchPath>);
      if (qVar5 == 0) goto LAB_001e15a5;
      LibrarySearchPath::LibrarySearchPath
                ((this->super_QArrayDataPointer<LibrarySearchPath>).ptr +
                 (this->super_QArrayDataPointer<LibrarySearchPath>).size,args);
LAB_001e16c4:
      pqVar2 = &(this->super_QArrayDataPointer<LibrarySearchPath>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_001e167d;
    }
LAB_001e15a5:
    if (i == 0) {
      qVar5 = QArrayDataPointer<LibrarySearchPath>::freeSpaceAtBegin
                        (&this->super_QArrayDataPointer<LibrarySearchPath>);
      if (qVar5 != 0) {
        LibrarySearchPath::LibrarySearchPath
                  ((this->super_QArrayDataPointer<LibrarySearchPath>).ptr + -1,args);
        ppLVar1 = &(this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
        *ppLVar1 = *ppLVar1 + -1;
        goto LAB_001e16c4;
      }
    }
  }
  tmp._default = true;
  tmp._49_7_ = 0xaaaaaaaaaaaaaa;
  tmp.super_QMakeLocalFileName.local_name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  tmp.super_QMakeLocalFileName.local_name.d.size = -0x5555555555555556;
  tmp.super_QMakeLocalFileName.real_name.d.size = -0x5555555555555556;
  tmp.super_QMakeLocalFileName.local_name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.super_QMakeLocalFileName.real_name.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  tmp.super_QMakeLocalFileName.real_name.d.ptr = (char16_t *)0xaaaaaaaaaaaaaaaa;
  LibrarySearchPath::LibrarySearchPath(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<LibrarySearchPath>).size != 0;
  QArrayDataPointer<LibrarySearchPath>::detachAndGrow
            (&this->super_QArrayDataPointer<LibrarySearchPath>,(uint)(i == 0 && bVar6),1,
             (LibrarySearchPath **)0x0,(QArrayDataPointer<LibrarySearchPath> *)0x0);
  if (i == 0 && bVar6) {
    LibrarySearchPath::LibrarySearchPath
              ((this->super_QArrayDataPointer<LibrarySearchPath>).ptr + -1,&tmp);
    ppLVar1 = &(this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
    *ppLVar1 = *ppLVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<LibrarySearchPath>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_b8.sourceCopyConstruct = 0;
    local_b8.nSource = 0;
    local_b8.move = 0;
    local_b8.sourceCopyAssign = 0;
    local_b8.end = (LibrarySearchPath *)0x0;
    local_b8.last = (LibrarySearchPath *)0x0;
    local_b8.where = (LibrarySearchPath *)0x0;
    local_b8.begin = (this->super_QArrayDataPointer<LibrarySearchPath>).ptr;
    local_b8.size = (this->super_QArrayDataPointer<LibrarySearchPath>).size;
    local_b8.data = &this->super_QArrayDataPointer<LibrarySearchPath>;
    Inserter::insertOne(&local_b8,i,&tmp);
    (local_b8.data)->ptr = local_b8.begin;
    (local_b8.data)->size = local_b8.size;
  }
  QMakeLocalFileName::~QMakeLocalFileName(&tmp.super_QMakeLocalFileName);
LAB_001e167d:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }